

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O0

void * benchmark_thread(void *param)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  unsigned_long uVar4;
  ulong uVar5;
  long *in_RDI;
  size_t __cpu;
  timeval end;
  timeval start;
  _func_ssize_t_nettlp_ptr_uintptr_t_void_ptr_size_t *dma;
  cpu_set_t target_cpu_set;
  char buf [4096];
  ssize_t ret;
  size_t len;
  size_t one_dma_len;
  size_t dma_len;
  uintptr_t addr;
  tlpperf_thread *th;
  undefined8 in_stack_ffffffffffffeec8;
  FILE *__stream;
  undefined4 in_stack_ffffffffffffeed0;
  undefined4 in_stack_ffffffffffffeed4;
  uint uVar6;
  uintptr_t in_stack_ffffffffffffeed8;
  uintptr_t uVar7;
  uintptr_t in_stack_ffffffffffffeee0;
  uintptr_t uVar8;
  timeval local_10f0;
  timeval local_10e0;
  code *local_10d0;
  cpu_set_t local_10c8;
  undefined1 local_1048 [4104];
  long local_40;
  uintptr_t local_38;
  ulong local_30;
  ulong local_28;
  uintptr_t local_20;
  long *local_18;
  
  local_18 = in_RDI;
  memset(&local_10c8,0,0x80);
  iVar1 = (int)local_18[5];
  if ((ulong)(long)iVar1 >> 3 < 0x80) {
    uVar5 = (ulong)(long)iVar1 >> 6;
    local_10c8.__bits[uVar5] = 1L << ((byte)iVar1 & 0x3f) | local_10c8.__bits[uVar5];
  }
  pthread_setaffinity_np(local_18[1],0x80,&local_10c8);
  if (nostdout == 0) {
    fprintf(_stdout,"%s: start on cpu %d, address %#lx, size %lu, len %lu\n","benchmark_thread",
            (ulong)*(uint *)(local_18 + 5),local_18[6],local_18[7],*(undefined8 *)(*local_18 + 0x20)
           );
  }
  if (*(int *)(*local_18 + 0xc) == 0) {
    local_30 = 0x800;
    local_10d0 = dma_read;
  }
  else {
    if (*(int *)(*local_18 + 0xc) != 1) {
      fprintf(_stderr,"%s:ERR: invalid direction on cpu %d\n","benchmark_thread",
              (ulong)*(uint *)(local_18 + 5));
      return (void *)0x0;
    }
    local_30 = 0x100;
    local_10d0 = dma_write;
  }
  local_20 = local_18[6];
  local_28 = *(ulong *)(*local_18 + 0x20);
  while( true ) {
    if (caught_signal != 0) {
      return (void *)0x0;
    }
    if (debug != 0) {
      fprintf(_stdout,"%s:DEBUG: DMA to %#lx, cpu %d\n","benchmark_thread",local_20,
              (ulong)*(uint *)(local_18 + 5));
    }
    uVar5 = local_30;
    if (local_28 < local_30) {
      uVar5 = local_28;
    }
    local_38 = uVar5;
    if (tlpperf->latency_mode != 0) {
      gettimeofday((timeval *)&local_10e0,(__timezone_ptr_t)0x0);
    }
    local_40 = (*local_10d0)(local_18 + 2,local_20,local_1048,local_38);
    if (tlpperf->latency_mode != 0) {
      gettimeofday((timeval *)&local_10f0,(__timezone_ptr_t)0x0);
    }
    if (local_40 < 0) break;
    if (tlpperf->latency_mode != 0) {
      uVar6 = *(uint *)(local_18 + 5);
      uVar4 = get_usec_elapsed(local_10e0,local_10f0);
      printf("latency: cpu on %d, %lu usec\n",(ulong)uVar6,uVar4);
    }
    local_18[8] = local_18[8] + 1;
    local_18[9] = local_40 + local_18[9];
    local_28 = local_28 - local_40;
    local_20 = next_target_addr(uVar5,in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                                CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                                (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
    if (local_28 == 0) {
      local_28 = *(ulong *)(*local_18 + 0x20);
    }
    if ((0 < (int)local_18[10]) &&
       (*(int *)(local_18 + 10) = (int)local_18[10] + -1, (int)local_18[10] == 0)) {
      return (void *)0x0;
    }
    if (*(int *)(*local_18 + 0x3c) != 0) {
      usleep(*(int *)(*local_18 + 0x3c) * 1000);
    }
  }
  uVar6 = *(uint *)(local_18 + 5);
  __stream = _stderr;
  uVar7 = local_20;
  uVar8 = local_38;
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  fprintf(__stream,"dma error on cpu %d. addr %#lx, len %lu: %s\n",(ulong)uVar6,uVar7,uVar8,pcVar3);
  return (void *)0x0;
}

Assistant:

void *benchmark_thread(void *param)
{
	struct tlpperf_thread *th = param;
	uintptr_t addr;
	size_t dma_len, one_dma_len, len;
	ssize_t ret;
	char buf[MRRS * 2];	/* x2 is just a buffer */
	cpu_set_t target_cpu_set;
	ssize_t (*dma)(struct nettlp *nt, uintptr_t addr,
		       void *buf, size_t count);
	struct timeval start, end;	/* for latency mode */

	CPU_ZERO(&target_cpu_set);
	CPU_SET(th->cpu, &target_cpu_set);
	pthread_setaffinity_np(th->tid, sizeof(cpu_set_t), &target_cpu_set);

	pr_info("start on cpu %d, address %#lx, size %lu, len %lu\n",
		th->cpu, th->region_addr, th->region_size, th->t->dma_len);

	switch (th->t->direction) {
	case DMA_DIRECTION_READ:
		one_dma_len = MRRS;
		dma = dma_read;
		break;
	case DMA_DIRECTION_WRITE:
		one_dma_len = MPS;
		dma = dma_write;
		break;
	default:
		pr_err("invalid direction on cpu %d\n", th->cpu);
		return NULL;
	}

	addr = th->region_addr;
	dma_len = th->t->dma_len;

	while (1) {

		if (caught_signal)
			break;

		pr_debug("DMA to %#lx, cpu %d\n", addr, th->cpu);

		len = dma_len < one_dma_len ? dma_len : one_dma_len;

		if (tlpperf->latency_mode)
			gettimeofday(&start, NULL);

		ret = dma(&th->nt, addr, buf, len);

		if (tlpperf->latency_mode)
			gettimeofday(&end, NULL);

		if (ret < 0) {
			fprintf(stderr,
				"dma error on cpu %d. "
				"addr %#lx, len %lu: %s\n",
				th->cpu, addr, len, strerror(errno));
			return NULL;
			goto next;
		}

		if (tlpperf->latency_mode) {
			printf("latency: cpu on %d, %lu usec\n",
			       th->cpu, get_usec_elapsed(start, end));
		}

		th->ntrans++;
		th->nbytes += ret;
		dma_len -= ret;
		addr = next_target_addr(addr, th->region_addr,
					th->region_addr + th->region_size,
					th->t->dma_len, th->t->pattern);

		if (dma_len == 0) {
			/* 1 transaction finished */
			dma_len = th->t->dma_len;
		}

	next:
		if (th->count > 0) {
			th->count--;
			if (th->count == 0)
				break;
		}

		if (th->t->interval)
			usleep(th->t->interval * 1000);
	}

	return NULL;
}